

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawFuzzColumnP_C(void)

{
  BYTE *pBVar1;
  int iVar2;
  BYTE *pBVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  pBVar1 = NormalLight.Maps;
  if (dc_yl == 0) {
    dc_yl = 1;
  }
  if (fuzzviewheight < dc_yh) {
    dc_yh = fuzzviewheight;
  }
  if (-1 < dc_yh - dc_yl) {
    iVar2 = (dc_yh - dc_yl) + 1;
    pBVar3 = dc_destorg + (long)dc_x + (long)ylookup[dc_yl];
    lVar4 = (long)dc_pitch;
    lVar5 = (long)fuzzpos;
    if (lVar5 != 0) {
      iVar7 = 0x32 - fuzzpos;
      iVar9 = iVar2;
      if (iVar7 < iVar2) {
        iVar9 = iVar7;
      }
      if (iVar2 < iVar7) {
        iVar7 = iVar2;
      }
      lVar8 = 0;
      do {
        *pBVar3 = pBVar1[(ulong)pBVar3[fuzzoffset[lVar8 + lVar5]] + 0x600];
        pBVar3 = pBVar3 + lVar4;
        lVar8 = lVar8 + 1;
      } while (iVar7 != (int)lVar8);
      iVar2 = iVar2 - iVar9;
      if ((0x32 - lVar5 != lVar8) && (iVar2 < 1)) {
        fuzzpos = fuzzpos + (int)lVar8;
        return;
      }
    }
    piVar6 = fuzzoffset;
    for (; 0x31 < iVar2; iVar2 = iVar2 + -0x32) {
      lVar5 = 0;
      do {
        *pBVar3 = pBVar1[(ulong)pBVar3[*(int *)((long)fuzzoffset + lVar5)] + 0x600];
        pBVar3 = pBVar3 + lVar4;
        lVar5 = lVar5 + 4;
      } while ((int)lVar5 != 200);
    }
    iVar9 = 0;
    fuzzpos = 0;
    if (0 < iVar2) {
      do {
        *pBVar3 = pBVar1[(ulong)pBVar3[*piVar6] + 0x600];
        pBVar3 = pBVar3 + lVar4;
        piVar6 = piVar6 + 1;
        iVar9 = iVar9 + 1;
        fuzzpos = iVar9;
      } while (iVar2 != iVar9);
    }
  }
  return;
}

Assistant:

void R_DrawFuzzColumnP_C (void)
{
	int count;
	BYTE *dest;

	// Adjust borders. Low...
	if (dc_yl == 0)
		dc_yl = 1;

	// .. and high.
	if (dc_yh > fuzzviewheight)
		dc_yh = fuzzviewheight;

	count = dc_yh - dc_yl;

	// Zero length.
	if (count < 0)
		return;

	count++;

	dest = ylookup[dc_yl] + dc_x + dc_destorg;

	// colormap #6 is used for shading (of 0-31, a bit brighter than average)
	{
		// [RH] Make local copies of global vars to try and improve
		//		the optimizations made by the compiler.
		int pitch = dc_pitch;
		int fuzz = fuzzpos;
		int cnt;
		BYTE *map = &NormalLight.Maps[6*256];

		// [RH] Split this into three separate loops to minimize
		// the number of times fuzzpos needs to be clamped.
		if (fuzz)
		{
			cnt = MIN(FUZZTABLE-fuzz,count);
			count -= cnt;
			do
			{
				*dest = map[dest[fuzzoffset[fuzz++]]];
				dest += pitch;
			} while (--cnt);
		}
		if (fuzz == FUZZTABLE || count > 0)
		{
			while (count >= FUZZTABLE)
			{
				fuzz = 0;
				cnt = FUZZTABLE;
				count -= FUZZTABLE;
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--cnt);
			}
			fuzz = 0;
			if (count > 0)
			{
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--count);
			}
		}
		fuzzpos = fuzz;
	}
}